

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# WasmByteCodeWriter.cpp
# Opt level: O0

bool __thiscall
Js::WasmByteCodeWriter::TryWriteWasmLoopStart<Js::LayoutSizePolicy<(Js::LayoutSize)1>>
          (WasmByteCodeWriter *this,OpCodeAsmJs op,uint loopId,RegSlot *curRegs)

{
  bool bVar1;
  uint local_38;
  unsigned_short local_34;
  unsigned_short uStack_32;
  Types type;
  OpLayoutT_WasmLoopStart<Js::LayoutSizePolicy<(Js::LayoutSize)1>_> layout;
  RegSlot *curRegs_local;
  uint loopId_local;
  OpCodeAsmJs op_local;
  WasmByteCodeWriter *this_local;
  
  layout.curRegs._2_8_ = curRegs;
  bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_short,unsigned_int>(&local_34,loopId)
  ;
  if (bVar1) {
    for (local_38 = 0; local_38 != 5; local_38 = local_38 + 1) {
      bVar1 = LayoutSizePolicy<(Js::LayoutSize)1>::Assign<unsigned_short,unsigned_int>
                        (&uStack_32 + local_38,*(uint *)(layout.curRegs._2_8_ + (ulong)local_38 * 4)
                        );
      if (!bVar1) {
        return false;
      }
    }
    ByteCodeWriter::Data::EncodeT<(Js::LayoutSize)1>
              (&(this->super_ByteCodeWriter).m_byteCodeData,op,&local_34,0xc,
               &this->super_ByteCodeWriter,false);
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool WasmByteCodeWriter::TryWriteWasmLoopStart(OpCodeAsmJs op, uint loopId, __in_ecount(WAsmJs::LIMIT) RegSlot* curRegs)
{
    OpLayoutT_WasmLoopStart<SizePolicy> layout;
    if (SizePolicy::Assign(layout.loopId, loopId))
    {
        for (WAsmJs::Types type = WAsmJs::Types(0); type != WAsmJs::LIMIT; type = WAsmJs::Types(type + 1))
        {
            if (!SizePolicy::Assign(layout.curRegs[type], curRegs[type]))
            {
                return false;
            }
        }

        m_byteCodeData.EncodeT<SizePolicy::LayoutEnum>(op, &layout, sizeof(layout), this);
        return true;
    }
    return false;
}